

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::UnaryFunctionLayerParams::MergePartialFromCodedStream
          (UnaryFunctionLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  int iVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  undefined8 local_38;
  
  local_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013f3e0;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013f3e0:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    iVar6 = 6;
    if ((uVar9 & 0x100000000) == 0) goto switchD_0013f42c_default;
    cVar7 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 != '\b') break;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar9 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0013f582;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_0013f582:
        uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar9;
      }
      iVar8 = local_38._4_4_;
      if (bVar4) {
        iVar8 = (int)uVar9;
        this->type_ = iVar8;
        iVar6 = 0;
      }
      local_38 = CONCAT44(iVar8,(float)local_38);
      if (bVar4) goto LAB_0013f468;
      goto LAB_0013f46a;
    case 2:
      if (cVar7 == '\x15') {
        puVar3 = input->buffer_;
        if (3 < *(int *)&input->buffer_end_ - (int)puVar3) {
          local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar3);
          input->buffer_ = puVar3 + 4;
LAB_0013f535:
          this->alpha_ = (float)local_38;
          goto LAB_0013f468;
        }
        bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_38);
        if (bVar4) goto LAB_0013f535;
        goto LAB_0013f46a;
      }
      break;
    case 3:
      if (cVar7 != '\x1d') break;
      puVar3 = input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
        bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_38);
        if (!bVar4) goto LAB_0013f46a;
      }
      else {
        local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar3);
        input->buffer_ = puVar3 + 4;
      }
      this->epsilon_ = (float)local_38;
      goto LAB_0013f468;
    case 4:
      if (cVar7 == '%') {
        puVar3 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
          bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar4) goto LAB_0013f46a;
        }
        else {
          local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar3);
          input->buffer_ = puVar3 + 4;
        }
        this->shift_ = (float)local_38;
        goto LAB_0013f468;
      }
      break;
    case 5:
      if (cVar7 == '-') {
        puVar3 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
          bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar4) goto LAB_0013f46a;
        }
        else {
          local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar3);
          input->buffer_ = puVar3 + 4;
        }
        this->scale_ = (float)local_38;
        goto LAB_0013f468;
      }
    }
switchD_0013f42c_default:
    if ((uVar5 & 7) == 4 || uVar5 == 0) {
      iVar6 = 7;
    }
    else {
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
      if (bVar4) {
LAB_0013f468:
        iVar6 = 0;
      }
    }
LAB_0013f46a:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool UnaryFunctionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.UnaryFunctionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::UnaryFunctionLayerParams_Operation >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float alpha = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &alpha_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float epsilon = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &epsilon_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float shift = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &shift_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float scale = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.UnaryFunctionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.UnaryFunctionLayerParams)
  return false;
#undef DO_
}